

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O2

int __thiscall asmjit::v1_14::a64::PrologEpilogInfo::init(PrologEpilogInfo *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  GroupData *pGVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  RegGroup group;
  undefined4 local_48;
  BitWordIterator<unsigned_int> it;
  
  uVar5 = 0;
  for (local_48 = 0; group = (RegGroup)local_48, group != kMask;
      local_48 = CONCAT31((int3)((uint)local_48 >> 8),(char)local_48 + '\x01')) {
    pGVar3 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
             operator[]<asmjit::v1_14::RegGroup>(&this->groups,&group);
    uVar1 = FuncFrame::saveRestoreRegSize((FuncFrame *)ctx,group);
    _it = FuncFrame::savedRegs((FuncFrame *)ctx,group);
    uVar6 = 0;
    if ((group == k0) && (((byte)*ctx & 0x10) != 0)) {
      pGVar3->pairs[0].offset = (uint16_t)uVar5;
      pGVar3->pairs[0].ids[0] = '\x1d';
      pGVar3->pairs[0].ids[1] = '\x1e';
      uVar5 = uVar5 + uVar1 * 2;
      _it = _it & 0x9fffffff;
      uVar4 = 1;
    }
    else {
      uVar4 = 0;
    }
    while( true ) {
      if (_it == 0) break;
      uVar2 = Support::BitWordIterator<unsigned_int>::next(&it);
      pGVar3->pairs[uVar4].ids[uVar6] = (uint8_t)uVar2;
      if (uVar6 == 1) {
        pGVar3->pairs[uVar4].offset = (uint16_t)uVar5;
        uVar5 = uVar5 + uVar1 * 2;
        uVar4 = uVar4 + 1;
      }
      uVar6 = (uint)(uVar6 != 1);
    }
    if (uVar6 == 1) {
      pGVar3->pairs[uVar4].ids[1] = 0xff;
      pGVar3->pairs[uVar4].offset = (uint16_t)uVar5;
      uVar5 = uVar1 * 2 + uVar5;
      uVar4 = uVar4 + 1;
    }
    pGVar3->pairCount = uVar4;
  }
  this->sizeTotal = uVar5;
  return 0;
}

Assistant:

Error init(const FuncFrame& frame) noexcept {
    uint32_t offset = 0;

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
      GroupData& data = groups[group];

      uint32_t n = 0;
      uint32_t pairCount = 0;
      RegPair* pairs = data.pairs;

      uint32_t slotSize = frame.saveRestoreRegSize(group);
      uint32_t savedRegs = frame.savedRegs(group);

      if (group == RegGroup::kGp && frame.hasPreservedFP()) {
        // Must be at the beginning of the push/pop sequence.
        ASMJIT_ASSERT(pairCount == 0);

        pairs[0].offset = uint16_t(offset);
        pairs[0].ids[0] = Gp::kIdFp;
        pairs[0].ids[1] = Gp::kIdLr;
        offset += slotSize * 2;
        pairCount++;

        savedRegs &= ~Support::bitMask(Gp::kIdFp, Gp::kIdLr);
      }

      Support::BitWordIterator<uint32_t> it(savedRegs);
      while (it.hasNext()) {
        pairs[pairCount].ids[n] = uint8_t(it.next());

        if (++n == 2) {
          pairs[pairCount].offset = uint16_t(offset);
          offset += slotSize * 2;

          n = 0;
          pairCount++;
        }
      }

      if (n == 1) {
        pairs[pairCount].ids[1] = uint8_t(BaseReg::kIdBad);
        pairs[pairCount].offset = uint16_t(offset);
        offset += slotSize * 2;
        pairCount++;
      }

      data.pairCount = pairCount;
    }

    sizeTotal = offset;
    return kErrorOk;
  }